

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Optimizer::MergePartialFromCodedStream
          (Optimizer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  SGDOptimizer *this_00;
  AdamOptimizer *this_01;
  pair<int,_int> pVar8;
  ulong uVar9;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0023828c;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0023828c:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
LAB_002382e5:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar6 == 0xb) {
        if ((char)uVar9 != 'Z') goto LAB_002382e5;
        if (this->_oneof_case_[0] == 0xb) {
          this_01 = (this->OptimizerType_).adamoptimizer_;
        }
        else {
          clear_OptimizerType(this);
          this->_oneof_case_[0] = 0xb;
          this_01 = (AdamOptimizer *)operator_new(0x40);
          AdamOptimizer::AdamOptimizer(this_01);
          (this->OptimizerType_).adamoptimizer_ = this_01;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar4 = AdamOptimizer::MergePartialFromCodedStream(this_01,input);
      }
      else {
        if ((uVar6 != 10) || ((char)uVar9 != 'R')) goto LAB_002382e5;
        if (this->_oneof_case_[0] == 10) {
          this_00 = (this->OptimizerType_).sgdoptimizer_;
        }
        else {
          clear_OptimizerType(this);
          this->_oneof_case_[0] = 10;
          this_00 = (SGDOptimizer *)operator_new(0x30);
          SGDOptimizer::SGDOptimizer(this_00);
          (this->OptimizerType_).sgdoptimizer_ = this_00;
        }
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (iVar7 = (int)(char)*puVar3, -1 < iVar7)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar7 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar7);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar4 = SGDOptimizer::MergePartialFromCodedStream(this_00,input);
      }
      if (bVar4 == false) {
        return false;
      }
      bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool Optimizer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Optimizer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.SGDOptimizer sgdOptimizer = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sgdoptimizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.AdamOptimizer adamOptimizer = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_adamoptimizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Optimizer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Optimizer)
  return false;
#undef DO_
}